

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  Reader file;
  Reader file_00;
  ExceptionCallback *pEVar1;
  ChangeKind *value;
  ChangeKind *value_00;
  bool bVar2;
  CappedArray<char,_14UL> *params_2;
  ChangeKind changeKind_local;
  Fault f_1;
  Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> exampleBuilder;
  Fault f;
  DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> _kjCondition;
  SchemaLoader loader;
  String argValues [1];
  Array<char> local_388;
  CappedArray<char,_14UL> local_370;
  Maybe<kj::Exception> exception;
  NullableValue<kj::Exception> local_1c0;
  
  params_2 = (CappedArray<char,_14UL> *)(ulong)sharedOrdinalCount;
  exampleBuilder.ptr.disposer = (Disposer *)0x0;
  exampleBuilder.ptr.ptr = (MallocMessageBuilder *)0x0;
  changeKind_local = changeKind;
  if (changeKind != INCOMPATIBLE) {
    kj::heap<capnp::MallocMessageBuilder>();
    exception.ptr._0_8_ = loader.impl.mutex._0_8_;
    exception.ptr.field_1.value.ownFile.content.ptr = (char *)loader.impl.mutex.waitersHead.ptr;
    loader.impl.mutex.waitersHead.ptr = (Waiter *)0x0;
    kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::operator=
              (&exampleBuilder.ptr,(Own<capnp::MallocMessageBuilder,_std::nullptr_t> *)&exception);
    kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::dispose
              ((Own<capnp::MallocMessageBuilder,_std::nullptr_t> *)&exception);
    kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::dispose
              ((Own<capnp::MallocMessageBuilder,_std::nullptr_t> *)&loader);
  }
  SchemaLoader::SchemaLoader(&loader);
  file._reader.capTable = file1._reader.capTable;
  file._reader.segment = file1._reader.segment;
  file._reader.data = file1._reader.data;
  file._reader.pointers = file1._reader.pointers;
  file._reader.dataSize = file1._reader.dataSize;
  file._reader.pointerCount = file1._reader.pointerCount;
  file._reader._38_2_ = file1._reader._38_2_;
  file._reader.nestingLimit = file1._reader.nestingLimit;
  file._reader._44_4_ = file1._reader._44_4_;
  loadFile((Maybe<kj::Exception> *)&local_1c0,file,&loader,true,&exampleBuilder,sharedOrdinalCount);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1c0);
  file_00._reader.capTable = file2._reader.capTable;
  file_00._reader.segment = file2._reader.segment;
  file_00._reader.data = file2._reader.data;
  file_00._reader.pointers = file2._reader.pointers;
  file_00._reader.dataSize = file2._reader.dataSize;
  file_00._reader.pointerCount = file2._reader.pointerCount;
  file_00._reader._38_2_ = file2._reader._38_2_;
  file_00._reader.nestingLimit = file2._reader.nestingLimit;
  file_00._reader._44_4_ = file2._reader._44_4_;
  loadFile(&exception,file_00,&loader,false,&exampleBuilder,sharedOrdinalCount);
  if (changeKind == INCOMPATIBLE) {
    _kjCondition.right = (None *)&kj::none;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = exception.ptr.isSet;
    _kjCondition.left = &exception;
    if (exception.ptr.isSet == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Exception>&,kj::None_const&>&,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != kj::none","_kjCondition,file1, file2",&_kjCondition,
                 &file1,&file2);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else {
    if (changeKind != COMPATIBLE) {
      _kjCondition.left = (Maybe<kj::Exception> *)&changeKind_local;
      _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,3);
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = changeKind == SUBTLY_COMPATIBLE;
      if (!_kjCondition.result) {
        f_1.exception = (Exception *)0x0;
        kj::_::
        tryToCharSequence<capnp::compiler::(anonymous_namespace)::ChangeKind,kj::CappedArray<char,14ul>>
                  ((CappedArray<char,_14UL> *)&f,(_ *)&changeKind_local,value);
        kj::_::
        tryToCharSequence<capnp::compiler::(anonymous_namespace)::ChangeKind,kj::CappedArray<char,14ul>>
                  (&local_370,(_ *)&_kjCondition.right,value_00);
        kj::_::concat<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
                  ((String *)&local_388,(_ *)&f,(CappedArray<char,_14UL> *)&_kjCondition.op,
                   (StringPtr *)&local_370,params_2);
        argValues[0].content.ptr = local_388.ptr;
        argValues[0].content.size_ = local_388.size_;
        argValues[0].content.disposer = local_388.disposer;
        local_388.ptr = (char *)0x0;
        local_388.size_ = 0;
        kj::Array<char>::~Array(&local_388);
        f.exception = (Exception *)argValues;
        kj::_::Debug::Fault::init
                  (&f_1,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                  );
        kj::Array<char>::~Array(&argValues[0].content);
        kj::_::Debug::Fault::fatal(&f_1);
      }
      bVar2 = true;
      goto LAB_0010e442;
    }
    bVar2 = true;
    if (exception.ptr.isSet != true) goto LAB_0010e442;
    pEVar1 = kj::getExceptionCallback();
    (*pEVar1->_vptr_ExceptionCallback[3])(pEVar1,&exception.ptr.field_1);
  }
  bVar2 = false;
LAB_0010e442:
  kj::_::NullableValue<kj::Exception>::~NullableValue(&exception.ptr);
  SchemaLoader::~SchemaLoader(&loader);
  kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::dispose(&exampleBuilder.ptr);
  return bVar2;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_SOME(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != kj::none, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}